

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classviewer.cpp
# Opt level: O3

void print_Fields(ClassFile *classFile)

{
  u2 accessFlags;
  ushort index;
  u2 index_00;
  ushort uVar1;
  field_info *pfVar2;
  FILE *pFVar3;
  char *pcVar4;
  attribute_info *paVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (classFile->fields_count != 0) {
    uVar6 = 0;
    do {
      pFVar3 = out;
      pfVar2 = classFile->fields;
      accessFlags = pfVar2[uVar6].access_flags;
      index = pfVar2[uVar6].name_index;
      index_00 = pfVar2[uVar6].descriptor_index;
      uVar1 = pfVar2[uVar6].attributes_count;
      paVar5 = pfVar2[uVar6].attributes;
      pcVar4 = getFormattedConstant(classFile->constant_pool,index);
      fprintf((FILE *)pFVar3,"\t[%hu] %s\n",uVar6 & 0xffffffff,pcVar4);
      fwrite("\t{\n",3,1,(FILE *)out);
      pFVar3 = out;
      pcVar4 = getFormattedConstant(classFile->constant_pool,index);
      fprintf((FILE *)pFVar3,"\t\tName: \t\t\t cp_info #%hu <%s>\n ",(ulong)index,pcVar4);
      pFVar3 = out;
      pcVar4 = getFormattedConstant(classFile->constant_pool,index_00);
      fprintf((FILE *)pFVar3,"\t\tDescriptor: \t cp_info #%hu <%s>\n ",(ulong)index_00,pcVar4);
      pFVar3 = out;
      pcVar4 = getAccessFlags(accessFlags);
      fprintf((FILE *)pFVar3,"\t\tAccess flags: \t %x [%s]\n",(ulong)accessFlags,pcVar4);
      fwrite("\t\tAttributes:\n",0xe,1,(FILE *)out);
      if ((ulong)uVar1 != 0) {
        uVar7 = 0;
        do {
          print_AttributeInfo(*paVar5,(uint32_t)uVar7,classFile->constant_pool,'\x03');
          uVar7 = uVar7 + 1;
          paVar5 = paVar5 + 1;
        } while (uVar1 != uVar7);
      }
      fwrite("\t}\n",3,1,(FILE *)out);
      uVar6 = uVar6 + 1;
    } while (uVar6 < classFile->fields_count);
  }
  return;
}

Assistant:

void print_Fields(ClassFile *classFile) {
	for (u2 i = 0; i < classFile->fields_count; i++) {
        field_info field = classFile->fields[i];
        
		fprintf(out,"\t[%hu] %s\n", i, getFormattedConstant(classFile->constant_pool, field.name_index));
		fprintf(out, "\t{\n");
		
		fprintf(out,"\t\tName: \t\t\t cp_info #%hu <%s>\n ", field.name_index, getFormattedConstant(classFile->constant_pool, field.name_index));
		fprintf(out,"\t\tDescriptor: \t cp_info #%hu <%s>\n ", field.descriptor_index, getFormattedConstant(classFile->constant_pool, field.descriptor_index));
		fprintf(out,"\t\tAccess flags: \t %x [%s]\n", field.access_flags, getAccessFlags(field.access_flags));
        
        fprintf(out,"\t\tAttributes:\n");
        
		for (u2 j = 0; j < field.attributes_count; j++) {
            print_AttributeInfo(field.attributes[j], j, classFile->constant_pool, 3);
		}
        
		fprintf(out, "\t}\n");
	}
}